

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O1

void __thiscall serial::Serial::SerialImpl::writeLock(SerialImpl *this)

{
  IOException *this_00;
  int errnum;
  string local_48;
  
  errnum = pthread_mutex_lock((pthread_mutex_t *)&this->write_mutex);
  if (errnum == 0) {
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x78);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]serial/src/impl/unix.cc"
             ,"");
  IOException::IOException(this_00,&local_48,0x41d,errnum);
  __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

void
Serial::SerialImpl::writeLock ()
{
  int result = pthread_mutex_lock(&this->write_mutex);
  if (result) {
    THROW (IOException, result);
  }
}